

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O1

pair<const_char_*,_int> __thiscall luna::VM::GetCurrentInstructionPos(VM *this)

{
  State *pSVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Closure *this_00;
  String *pSVar4;
  int iVar5;
  Function *this_01;
  Instruction *pIVar6;
  char *__assertion;
  anon_union_16_2_eed97686_for_String_2 *paVar7;
  pair<const_char_*,_int> pVar8;
  
  pSVar1 = this->state_;
  if ((pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&pSVar1->calls_) {
    __assertion = "!state_->calls_.empty()";
  }
  else {
    p_Var2 = (pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
    p_Var3 = p_Var2[1]._M_prev;
    if ((p_Var3 != (_List_node_base *)0x0) &&
       (this_00 = (Closure *)p_Var3->_M_next, this_00 != (Closure *)0x0)) {
      this_01 = Closure::GetPrototype(this_00);
      p_Var2 = p_Var2[2]._M_next;
      pIVar6 = Function::GetOpCodes(this_01);
      pSVar4 = this_01->module_;
      if ((pSVar4->super_GCObject).field_0x11 == '\0') {
        paVar7 = &pSVar4->field_1;
      }
      else {
        paVar7 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar4->field_1).str_;
      }
      iVar5 = Function::GetInstructionLine
                        (this_01,(int)((ulong)((long)p_Var2 + (-4 - (long)pIVar6)) >> 2));
      pVar8.second = iVar5;
      pVar8.first = (char *)paVar7;
      pVar8._12_4_ = 0;
      return pVar8;
    }
    __assertion = "call->func_ && call->func_->closure_";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x22e,"std::pair<const char *, int> luna::VM::GetCurrentInstructionPos() const");
}

Assistant:

std::pair<const char *, int> VM::GetCurrentInstructionPos() const
    {
        GET_CALLINFO_AND_PROTO();
        auto index = call->instruction_ - 1 - proto->GetOpCodes();
        return { proto->GetModule()->GetCStr(),
                 proto->GetInstructionLine(index) };
    }